

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile,string *objPath)

{
  pointer pcVar1;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  string *psVar4;
  cmGeneratedFileStream *this_00;
  ostream *poVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string buildFilePath;
  string sourceFileName;
  string buildFileDir;
  string local_f0;
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + psVar4->_M_string_length);
  pcVar2 = (this->CompileCommandsStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar2 == (cmGeneratedFileStream *)0x0) {
    local_d0._0_8_ = local_90._M_string_length;
    local_d0._8_8_ = local_90._M_dataplus._M_p;
    local_d0._16_8_ = 0x16;
    local_d0._24_8_ = "/compile_commands.json";
    views._M_len = 2;
    views._M_array = (iterator)local_d0;
    cmCatViews_abi_cxx11_(&local_f0,views);
    if (this->ComputingUnknownDependencies == true) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"compile_commands.json","");
      NinjaOutputPath((string *)local_d0,this,&local_b0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedBuildOutputs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_f0,false,None);
    pcVar2 = (this->CompileCommandsStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CompileCommandsStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_00;
    if (pcVar2 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar2->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      this_00 = (this->CompileCommandsStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,",\n",2);
  }
  pcVar1 = (sourceFile->_M_dataplus)._M_p;
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + sourceFile->_M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_d0);
  if (!bVar3) {
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmsys::SystemTools::CollapseFullPath(&local_f0,(string *)local_d0,psVar4);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->CompileCommandsStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"  \"directory\": \"",0x10);
  cmGlobalGenerator::EscapeJSON(&local_f0,&local_90);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"command\": \"",0xe);
  cmGlobalGenerator::EscapeJSON(&local_b0,commandLine);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"file\": \"",0xb);
  cmGlobalGenerator::EscapeJSON(&local_50,(string *)local_d0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"output\": \"",0xd);
  cmGlobalGenerator::EscapeJSON(&local_70,objPath);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile,
  const std::string& objPath)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath =
      cmStrCat(buildFileDir, "/compile_commands.json");
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      cm::make_unique<cmGeneratedFileStream>(buildFilePath);
    *this->CompileCommandsStream << "[\n";
  } else {
    *this->CompileCommandsStream << ",\n";
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "{\n"
     << R"(  "directory": ")"
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << R"(  "command": ")"
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << R"(  "file": ")"
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\",\n"
     << R"(  "output": ")"
     << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n"
     << "}";
  /* clang-format on */
}